

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

bool __thiscall OpenMesh::IO::_PLYReader_::can_u_read(_PLYReader_ *this,istream *_is)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *psVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ValueType VVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  long lVar9;
  mapped_type *pmVar10;
  mostream *pmVar11;
  ostream *poVar12;
  char *pcVar13;
  VertexPropertyInfo *pVVar14;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  string listEntryType;
  string listIndexType;
  float version;
  undefined1 local_158 [8];
  string fileType;
  string elementName;
  string keyword;
  string tmp2;
  string tmp1;
  string propertyName;
  undefined1 local_90 [8];
  string line;
  VertexPropertyInfo entry;
  uint local_34;
  
  (this->options_).flags_ = 0;
  entry.name.field_2._8_8_ = &this->vertexPropertyMap_;
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>,_std::_Select1st<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>,_std::_Select1st<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
           *)entry.name.field_2._8_8_);
  this->vertexPropertyCount_ = 0;
  local_90 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>(_is,(string *)local_90);
  elementName.field_2._8_8_ = line._M_dataplus._M_p + (long)local_90;
  local_158 = local_90;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&line.field_2 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&elementName.field_2 + 8),
             (unary_negate<std::pointer_to_unary_function<int,_int>_>)local_158);
  std::__cxx11::string::erase
            (local_90,CONCAT44(line.field_2._12_4_,line.field_2._8_4_),
             (long)local_90 + line._M_dataplus._M_p);
  auVar3 = local_90;
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                    (local_90,line._M_dataplus._M_p + (long)local_90,isspace);
  std::__cxx11::string::erase(local_90,auVar3,_Var8._M_current);
  bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_90,"PLY");
  if (bVar4) {
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"ply");
    if (bVar4) {
      bVar4 = false;
      goto LAB_0019af0b;
    }
  }
  this->vertexCount_ = 0;
  this->faceCount_ = 0;
  this->vertexDimension_ = 0;
  elementName.field_2._8_8_ = &keyword._M_string_length;
  keyword._M_dataplus._M_p = (pointer)0x0;
  keyword._M_string_length._0_1_ = 0;
  local_158 = (undefined1  [8])&fileType._M_string_length;
  fileType._M_dataplus._M_p = (pointer)0x0;
  fileType._M_string_length._0_1_ = 0;
  std::__cxx11::string::string
            ((string *)(fileType.field_2._M_local_buf + 8),"",
             (allocator *)(line.field_2._M_local_buf + 8));
  tmp1.field_2._8_8_ = &propertyName._M_string_length;
  propertyName._M_dataplus._M_p = (pointer)0x0;
  listEntryType.field_2._8_8_ = &listIndexType._M_string_length;
  listIndexType._M_dataplus._M_p = (pointer)0x0;
  propertyName._M_string_length._0_1_ = 0;
  listIndexType._M_string_length._0_1_ = 0;
  local_1b0 = (undefined1  [8])&listEntryType._M_string_length;
  listEntryType._M_dataplus._M_p = (pointer)0x0;
  listEntryType._M_string_length._0_1_ = 0;
  std::operator>>(_is,(string *)(elementName.field_2._M_local_buf + 8));
  std::operator>>(_is,(string *)local_158);
  std::istream::_M_extract<float>((float *)_is);
  if (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 1) == 0) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_158,"ascii");
    if (bVar4) {
      uVar6 = (this->options_).flags_ & 0xfffffffe;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_158,"binary_little_endian");
      if (bVar4) {
        uVar6 = (this->options_).flags_ | 5;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_158,"binary_big_endian");
        if (!bVar4) {
          pmVar11 = omerr();
          poVar12 = std::operator<<(&pmVar11->super_ostream,"Unsupported PLY format: ");
          poVar12 = std::operator<<(poVar12,(string *)local_158);
          goto LAB_0019a46b;
        }
        uVar6 = (this->options_).flags_ | 3;
      }
    }
    (this->options_).flags_ = uVar6;
    lVar9 = std::istream::tellg();
    std::operator>>(_is,(string *)(elementName.field_2._M_local_buf + 8));
    propertyName.field_2._8_8_ = (long)&listEntryType.field_2 + 8;
    do {
      pVVar14 = (VertexPropertyInfo *)(&line.field_2._M_allocated_capacity + 1);
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&elementName.field_2 + 8),"end_header");
      if (!bVar4) {
        if (((this->options_).flags_ & 1) != 0) {
          std::istream::seekg(_is,lVar9 + 0xc,0);
        }
        goto LAB_0019aebf;
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (&elementName.field_2._M_allocated_capacity + 1);
      bVar5 = std::operator==(pbVar1,"comment");
      if (bVar5) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>(_is,(string *)local_90);
      }
      else {
        bVar5 = std::operator==(pbVar1,"element");
        if (bVar5) {
          std::operator>>(_is,(string *)(fileType.field_2._M_local_buf + 8));
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&fileType.field_2 + 8),"vertex");
          if (!bVar5) {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&fileType.field_2 + 8),"face");
            if (!bVar5) {
              pmVar11 = omerr();
              poVar12 = std::operator<<(&pmVar11->super_ostream,
                                        "PLY header unsupported element type: ");
              psVar2 = &fileType;
              goto LAB_0019a6a5;
            }
          }
          std::istream::_M_extract<unsigned_int>((uint *)_is);
        }
        else {
          bVar5 = std::operator==(pbVar1,"property");
          if (bVar5) {
            tmp2.field_2._8_8_ = &tmp1._M_string_length;
            tmp1._M_dataplus._M_p = (pointer)0x0;
            tmp1._M_string_length._0_1_ = 0;
            keyword.field_2._8_8_ = &tmp2._M_string_length;
            tmp2._M_dataplus._M_p = (pointer)0x0;
            tmp2._M_string_length._0_1_ = 0;
            std::operator>>(_is,(string *)(tmp2.field_2._M_local_buf + 8));
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&tmp2.field_2 + 8),"list");
            if (bVar5) {
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fileType.field_2 + 8);
              bVar5 = std::operator==(pbVar1,"vertex");
              if (bVar5) {
                pmVar11 = omerr();
                pcVar13 = "List type not supported for vertices!";
LAB_0019a8b9:
                poVar12 = std::operator<<(&pmVar11->super_ostream,pcVar13);
                std::endl<char,std::char_traits<char>>(poVar12);
              }
              else {
                bVar5 = std::operator==(pbVar1,"face");
                if (bVar5) {
                  std::operator>>(_is,(string *)(listEntryType.field_2._M_local_buf + 8));
                  std::operator>>(_is,(string *)local_1b0);
                  std::operator>>(_is,(string *)(tmp1.field_2._M_local_buf + 8));
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&listEntryType.field_2 + 8),"uint8");
                  VVar7 = ValueTypeUINT8;
                  if (!bVar5) {
                    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&listEntryType.field_2 + 8),"uchar");
                    VVar7 = ValueTypeUCHAR;
                    if (bVar5) goto LAB_0019a863;
                    pmVar11 = omerr();
                    poVar12 = std::operator<<(&pmVar11->super_ostream,
                                              "Unsupported Index type for face list: ");
LAB_0019af68:
                    poVar12 = std::operator<<(poVar12,(string *)propertyName.field_2._8_8_);
                    std::endl<char,std::char_traits<char>>(poVar12);
                    std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
                    std::__cxx11::string::~string((string *)(tmp2.field_2._M_local_buf + 8));
                    goto LAB_0019aebf;
                  }
LAB_0019a863:
                  this->faceIndexType_ = VVar7;
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1b0,"int32");
                  if (bVar5) {
                    this->faceEntryType_ = ValueTypeINT32;
                  }
                  else {
                    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1b0,"int");
                    if (bVar5) {
                      this->faceEntryType_ = ValueTypeINT;
                    }
                    else {
                      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1b0,"uint32");
                      if (bVar5) {
                        this->faceEntryType_ = ValueTypeUINT32;
                      }
                      else {
                        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_1b0,"uint");
                        if (!bVar5) {
                          pmVar11 = omerr();
                          poVar12 = std::operator<<(&pmVar11->super_ostream,
                                                    "Unsupported Entry type for face list: ");
                          propertyName.field_2._8_8_ = local_1b0;
                          goto LAB_0019af68;
                        }
                        this->faceEntryType_ = ValueTypeUINT;
                      }
                    }
                  }
                }
              }
            }
            else {
              std::operator>>(_is,(string *)(keyword.field_2._M_local_buf + 8));
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&fileType.field_2 + 8);
              bVar5 = std::operator==(pbVar1,"vertex");
              if (!bVar5) {
                bVar5 = std::operator==(pbVar1,"face");
                if (!bVar5) goto LAB_0019a977;
                pmVar11 = omerr();
                pcVar13 = "Properties not supported for faces ";
                goto LAB_0019a8b9;
              }
              std::__cxx11::string::string
                        ((string *)&local_210,(string *)(tmp2.field_2._M_local_buf + 8));
              std::__cxx11::string::string
                        ((string *)&local_230,(string *)(keyword.field_2._M_local_buf + 8));
              VVar7 = get_property_type(&local_210,&local_230);
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::string::~string((string *)&local_210);
              std::__cxx11::string::string
                        ((string *)&local_1d0,(string *)(tmp2.field_2._M_local_buf + 8));
              std::__cxx11::string::string
                        ((string *)&local_1f0,(string *)(keyword.field_2._M_local_buf + 8));
              get_property_name((string *)pVVar14,&local_1d0,&local_1f0);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (&tmp1.field_2._M_allocated_capacity + 1);
              std::__cxx11::string::operator=((string *)pbVar1,(string *)pVVar14);
              std::__cxx11::string::~string((string *)pVVar14);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_1d0);
              bVar5 = std::operator==(pbVar1,"x");
              if (bVar5) {
                VertexPropertyInfo::VertexPropertyInfo(pVVar14,XCOORD,VVar7);
                local_34 = this->vertexPropertyCount_;
                pmVar10 = std::
                          map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                          ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                        *)entry.name.field_2._8_8_,(key_type *)&local_34);
                VertexPropertyInfo::operator=(pmVar10,pVVar14);
LAB_0019a962:
                this->vertexDimension_ = this->vertexDimension_ + 1;
LAB_0019a96a:
                std::__cxx11::string::~string((string *)&entry);
              }
              else {
                bVar5 = std::operator==(pbVar1,"y");
                if (bVar5) {
                  pVVar14 = (VertexPropertyInfo *)((long)&line.field_2 + 8);
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,YCOORD,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
                  goto LAB_0019a962;
                }
                bVar5 = std::operator==(pbVar1,"z");
                pVVar14 = (VertexPropertyInfo *)(&line.field_2._M_allocated_capacity + 1);
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,ZCOORD,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
                  goto LAB_0019a962;
                }
                bVar5 = std::operator==(pbVar1,"nx");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,XNORM,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
LAB_0019aafa:
                  *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x10;
                  goto LAB_0019a96a;
                }
                bVar5 = std::operator==(pbVar1,"ny");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,YNORM,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
                  goto LAB_0019aafa;
                }
                bVar5 = std::operator==(pbVar1,"nz");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,ZNORM,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
                  goto LAB_0019aafa;
                }
                bVar5 = std::operator==(pbVar1,"u");
                if (bVar5) {
LAB_0019ab2e:
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,TEXX,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
LAB_0019ab5e:
                  *(byte *)&(this->options_).flags_ = (byte)(this->options_).flags_ | 0x40;
                  goto LAB_0019a96a;
                }
                bVar5 = std::operator==(pbVar1,"s");
                if (bVar5) goto LAB_0019ab2e;
                bVar5 = std::operator==(pbVar1,"v");
                if (bVar5) {
LAB_0019ab92:
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,TEXY,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
                  goto LAB_0019ab5e;
                }
                bVar5 = std::operator==(pbVar1,"t");
                if (bVar5) goto LAB_0019ab92;
                bVar5 = std::operator==(pbVar1,"red");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo(pVVar14,COLORRED,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=(pmVar10,pVVar14);
LAB_0019ad8a:
                  uVar6 = (uint)(VVar7 - ValueTypeFLOAT32 < 2) << 0xc | (this->options_).flags_ |
                          0x20;
LAB_0019ada6:
                  (this->options_).flags_ = uVar6;
                  goto LAB_0019a96a;
                }
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&tmp1.field_2 + 8),"green");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo
                            ((VertexPropertyInfo *)((long)&line.field_2 + 8),COLORGREEN,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=
                            (pmVar10,(VertexPropertyInfo *)((long)&line.field_2 + 8));
                  goto LAB_0019ad8a;
                }
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&tmp1.field_2 + 8),"blue");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo
                            ((VertexPropertyInfo *)((long)&line.field_2 + 8),COLORBLUE,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=
                            (pmVar10,(VertexPropertyInfo *)((long)&line.field_2 + 8));
                  goto LAB_0019ad8a;
                }
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&tmp1.field_2 + 8),"diffuse_red");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo
                            ((VertexPropertyInfo *)((long)&line.field_2 + 8),COLORRED,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=
                            (pmVar10,(VertexPropertyInfo *)((long)&line.field_2 + 8));
                  goto LAB_0019ad8a;
                }
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&tmp1.field_2 + 8),"diffuse_green");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo
                            ((VertexPropertyInfo *)((long)&line.field_2 + 8),COLORGREEN,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=
                            (pmVar10,(VertexPropertyInfo *)((long)&line.field_2 + 8));
                  goto LAB_0019ad8a;
                }
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&tmp1.field_2 + 8),"diffuse_blue");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo
                            ((VertexPropertyInfo *)((long)&line.field_2 + 8),COLORBLUE,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=
                            (pmVar10,(VertexPropertyInfo *)((long)&line.field_2 + 8));
                  goto LAB_0019ad8a;
                }
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&tmp1.field_2 + 8),"alpha");
                if (bVar5) {
                  VertexPropertyInfo::VertexPropertyInfo
                            ((VertexPropertyInfo *)((long)&line.field_2 + 8),COLORALPHA,VVar7);
                  local_34 = this->vertexPropertyCount_;
                  pmVar10 = std::
                            map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                            ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                          *)entry.name.field_2._8_8_,(key_type *)&local_34);
                  VertexPropertyInfo::operator=
                            (pmVar10,(VertexPropertyInfo *)((long)&line.field_2 + 8));
                  uVar6 = (uint)(VVar7 - ValueTypeFLOAT32 < 2) << 0xc | (this->options_).flags_ |
                          0x820;
                  goto LAB_0019ada6;
                }
                uVar6 = (this->options_).flags_;
                if ((uVar6 & 1) == 0) {
                  (this->options_).flags_ = uVar6 | 0x2000;
                }
                line.field_2._8_4_ = uVar6 & 1 | 0xc;
                line.field_2._12_4_ = VVar7;
                std::__cxx11::string::string
                          ((string *)&entry,(string *)(tmp1.field_2._M_local_buf + 8));
                local_34 = this->vertexPropertyCount_;
                pmVar10 = std::
                          map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                          ::operator[]((map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                                        *)entry.name.field_2._8_8_,(key_type *)&local_34);
                VertexPropertyInfo::operator=
                          (pmVar10,(VertexPropertyInfo *)((long)&line.field_2 + 8));
                std::__cxx11::string::~string((string *)&entry);
              }
              this->vertexPropertyCount_ = this->vertexPropertyCount_ + 1;
            }
LAB_0019a977:
            std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(tmp2.field_2._M_local_buf + 8));
          }
          else {
            pmVar11 = omlog();
            poVar12 = std::operator<<(&pmVar11->super_ostream,"Unsupported keyword : ");
            psVar2 = &elementName;
LAB_0019a6a5:
            poVar12 = std::operator<<(poVar12,(string *)((psVar2->field_2)._M_local_buf + 8));
            std::endl<char,std::char_traits<char>>(poVar12);
          }
        }
      }
      lVar9 = std::istream::tellg();
      std::operator>>(_is,(string *)(elementName.field_2._M_local_buf + 8));
    } while (((byte)_is[*(long *)(*(long *)_is + -0x18) + 0x20] & 1) == 0);
    pmVar11 = omerr();
    poVar12 = std::operator<<(&pmVar11->super_ostream,"Error while reading PLY file header");
    std::endl<char,std::char_traits<char>>(poVar12);
LAB_0019aebf:
    bVar4 = !bVar4;
  }
  else {
    pmVar11 = omerr();
    poVar12 = std::operator<<(&pmVar11->super_ostream,"Defect PLY header detected");
LAB_0019a46b:
    std::endl<char,std::char_traits<char>>(poVar12);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)(listEntryType.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tmp1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(fileType.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)(elementName.field_2._M_local_buf + 8));
LAB_0019af0b:
  std::__cxx11::string::~string((string *)local_90);
  return bVar4;
}

Assistant:

bool _PLYReader_::can_u_read(std::istream& _is) const {

    // Clear per file options
    options_.cleanup();

    // clear vertex property map, will be recreated
    vertexPropertyMap_.clear();
    vertexPropertyCount_ = 0;

    // read 1st line
    std::string line;
    std::getline(_is, line);
    trim(line);

    //Check if this file is really a ply format
    if (line != "PLY" && line != "ply")
        return false;

    vertexCount_ = 0;
    faceCount_ = 0;
    vertexDimension_ = 0;

    std::string keyword;
    std::string fileType;
    std::string elementName = "";
    std::string propertyName;
    std::string listIndexType;
    std::string listEntryType;
    float version;

    _is >> keyword;
    _is >> fileType;
    _is >> version;

    if (_is.bad()) {
        omerr() << "Defect PLY header detected" << std::endl;
        return false;
    }

    if (fileType == "ascii") {
        options_ -= Options::Binary;
    } else if (fileType == "binary_little_endian") {
        options_ += Options::Binary;
        options_ += Options::LSB;
        //if (Endian::local() == Endian::MSB)

        //  options_ += Options::Swap;
    } else if (fileType == "binary_big_endian") {
        options_ += Options::Binary;
        options_ += Options::MSB;
        //if (Endian::local() == Endian::LSB)

        //  options_ += Options::Swap;
    } else {
        omerr() << "Unsupported PLY format: " << fileType << std::endl;
        return false;
    }

    std::streamoff streamPos = _is.tellg();
    _is >> keyword;
    while (keyword != "end_header") {

        if (keyword == "comment") {
            std::getline(_is, line);
        } else if (keyword == "element") {
            _is >> elementName;
            if (elementName == "vertex") {
                _is >> vertexCount_;
            } else if (elementName == "face") {
                _is >> faceCount_;
            } else {
                omerr() << "PLY header unsupported element type: " << elementName << std::endl;
            }
        } else if (keyword == "property") {
            std::string tmp1;
            std::string tmp2;

            // Read first keyword, as it might be a list
            _is >> tmp1;

            if (tmp1 == "list") {
                if (elementName == "vertex") {
                    omerr() << "List type not supported for vertices!" << std::endl;
                } else if (elementName == "face") {
                    _is >> listIndexType;
                    _is >> listEntryType;
                    _is >> propertyName;

                    if (listIndexType == "uint8") {
                        faceIndexType_ = ValueTypeUINT8;
                    } else if (listIndexType == "uchar") {
                        faceIndexType_ = ValueTypeUCHAR;
                    } else {
                        omerr() << "Unsupported Index type for face list: " << listIndexType << std::endl;
                        return false;
                    }

                    if (listEntryType == "int32") {
                        faceEntryType_ = ValueTypeINT32;
                    } else if (listEntryType == "int") {
                        faceEntryType_ = ValueTypeINT;
                    } else if (listEntryType == "uint32") {
                        faceEntryType_ = ValueTypeUINT32;
                    } else if (listEntryType == "uint") {
                        faceEntryType_ = ValueTypeUINT;
                    } else {
                        omerr() << "Unsupported Entry type for face list: " << listEntryType << std::endl;
                        return false;
                    }

                }
            } else {
                // as this is not a list property, read second value of property
                _is >> tmp2;

                if (elementName == "vertex") {
                    // Extract name and type of property
                    // As the order seems to be different in some files, autodetect it.
                    ValueType valueType = get_property_type(tmp1, tmp2);
                    propertyName = get_property_name(tmp1, tmp2);

                    if (propertyName == "x") {
                      VertexPropertyInfo entry(XCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "y") {
                      VertexPropertyInfo entry(YCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "z") {
                      VertexPropertyInfo entry(ZCOORD, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      vertexDimension_++;
                    } else if (propertyName == "nx") {
                      VertexPropertyInfo entry(XNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "ny") {
                      VertexPropertyInfo entry(YNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "nz") {
                      VertexPropertyInfo entry(ZNORM, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexNormal;
                    } else if (propertyName == "u" || propertyName == "s") {
                      VertexPropertyInfo entry(TEXX, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "v" || propertyName == "t") {
                      VertexPropertyInfo entry(TEXY, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexTexCoord;
                    } else if (propertyName == "red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_red") {
                      VertexPropertyInfo entry(COLORRED, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_green") {
                      VertexPropertyInfo entry(COLORGREEN, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "diffuse_blue") {
                      VertexPropertyInfo entry(COLORBLUE, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else if (propertyName == "alpha") {
                      VertexPropertyInfo entry(COLORALPHA, valueType);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                      options_ += Options::VertexColor;
                      options_ += Options::ColorAlpha;
                      if (valueType == ValueTypeFLOAT || valueType == ValueTypeFLOAT32)
                        options_ += Options::ColorFloat;
                    } else {
                      VertexProperty prop = (!options_.is_binary()) ? CUSTOM_PROP : UNSUPPORTED; // loading vertex properties is not yet supported by the binary loader
                      if (prop != UNSUPPORTED)
                        options_ += Options::Custom;
                      VertexPropertyInfo entry(prop, valueType, propertyName);
                      vertexPropertyMap_[vertexPropertyCount_] = entry;
                    }

                    vertexPropertyCount_++;

                } else if (elementName == "face") {
                    omerr() << "Properties not supported for faces " << std::endl;
                }

            }

        } else {
            omlog() << "Unsupported keyword : " << keyword << std::endl;
        }

        streamPos = _is.tellg();
        _is >> keyword;
        if (_is.bad()) {
            omerr() << "Error while reading PLY file header" << std::endl;
            return false;
        }
    }

    // As the binary data is directy after the end_header keyword
    // and the stream removes too many bytes, seek back to the right position
    if (options_.is_binary()) {
        _is.seekg(streamPos + 12);
    }

    return true;
}